

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

pair<bool,_bool> __thiscall
chaiscript::dispatch::Dynamic_Proxy_Function::call_match_internal
          (Dynamic_Proxy_Function *this,Function_Params *vals,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  pair<bool,_bool> pVar2;
  ushort uVar3;
  anon_class_24_3_3d35c925 local_38;
  
  local_38.this = this;
  local_38.vals = vals;
  local_38.t_conversions = t_conversions;
  pVar2 = call_match_internal::anon_class_24_3_3d35c925::operator()(&local_38);
  if (((ushort)pVar2 & 1) == 0) {
    uVar3 = 0;
  }
  else {
    bVar1 = test_guard(this,vals,t_conversions);
    uVar3 = (ushort)bVar1;
  }
  return (pair<bool,_bool>)(uVar3 | (ushort)pVar2 & 0xff00);
}

Assistant:

std::pair<bool, bool> call_match_internal(const Function_Params &vals, const Type_Conversions_State &t_conversions) const {
        const auto comparison_result = [&]() {
          if (m_arity < 0) {
            return std::make_pair(true, false);
          } else if (vals.size() == size_t(m_arity)) {
            return m_param_types.match(vals, t_conversions);
          } else {
            return std::make_pair(false, false);
          }
        }();

        return std::make_pair(comparison_result.first && test_guard(vals, t_conversions), comparison_result.second);
      }